

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Loop.hpp
# Opt level: O3

void __thiscall uv::Loop::run(Loop *this)

{
  uint uVar1;
  Exception *this_00;
  error_code ec;
  
  uVar1 = uv_run(this->loop_ptr_,0);
  if (uVar1 == 0) {
    return;
  }
  if (getCategory()::instance == '\0') {
    run();
  }
  this_00 = (Exception *)__cxa_allocate_exception(0x38);
  ec._4_4_ = 0;
  ec._M_value = uVar1;
  ec._M_cat = (error_category *)&getCategory()::instance;
  Exception::Exception(this_00,ec);
  __cxa_throw(this_00,&Exception::typeinfo,Exception::~Exception);
}

Assistant:

inline void Loop::run(std::error_code &ec)
	{
		auto status = uv_run(loop_ptr_, UV_RUN_DEFAULT);
		
		if (status != 0) {
			ec = makeErrorCode(status);
		}
	}